

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesDeviceGetSubDevicePropertiesExp
          (zes_device_handle_t hDevice,uint32_t *pCount,
          zes_subdevice_exp_properties_t *pSubdeviceProps)

{
  zes_pfnDeviceGetSubDevicePropertiesExp_t pfnGetSubDevicePropertiesExp;
  ze_result_t result;
  zes_subdevice_exp_properties_t *pSubdeviceProps_local;
  uint32_t *pCount_local;
  zes_device_handle_t hDevice_local;
  
  pfnGetSubDevicePropertiesExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cae8 != (code *)0x0) {
    pfnGetSubDevicePropertiesExp._4_4_ = (*DAT_0011cae8)(hDevice,pCount,pSubdeviceProps);
  }
  return pfnGetSubDevicePropertiesExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceGetSubDevicePropertiesExp(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        uint32_t* pCount,                               ///< [in,out] pointer to the number of sub devices.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of sub devices currently attached to the device.
                                                        ///< if count is greater than the number of sub devices currently attached
                                                        ///< to the device, then the driver shall update the value with the correct
                                                        ///< number of sub devices.
        zes_subdevice_exp_properties_t* pSubdeviceProps ///< [in,out][optional][range(0, *pCount)] array of sub device property structures.
                                                        ///< if count is less than the number of sysman sub devices available, then
                                                        ///< the driver shall only retrieve that number of sub device property structures.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetSubDevicePropertiesExp = context.zesDdiTable.DeviceExp.pfnGetSubDevicePropertiesExp;
        if( nullptr != pfnGetSubDevicePropertiesExp )
        {
            result = pfnGetSubDevicePropertiesExp( hDevice, pCount, pSubdeviceProps );
        }
        else
        {
            // generic implementation
        }

        return result;
    }